

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O0

void __thiscall KDReports::Test::initTestCase(Test *this)

{
  int t;
  QDebug *pQVar1;
  QString local_e0;
  QMessageLogger local_c8;
  QDebug local_a8;
  QDebug local_a0;
  QFontMetrics local_98 [8];
  QMessageLogger local_90;
  QDebug local_70;
  QString local_68;
  QFontInfo local_50 [8];
  QFontInfo info;
  QString local_38;
  QFont local_20 [8];
  QFont font;
  Test *this_local;
  
  QCoreApplication::instance();
  QCoreApplication::setAttribute(AA_Use96Dpi,true);
  QString::QString(&local_38,"Noto Sans");
  QFont::QFont(local_20,&local_38,0x30,-1,false);
  QString::~QString(&local_38);
  QFontInfo::QFontInfo(local_50,local_20);
  QFontInfo::family();
  fontFound = QString::operator==(&local_68,"Noto Sans");
  QString::~QString(&local_68);
  QMessageLogger::QMessageLogger
            (&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
             ,0x30,"void KDReports::Test::initTestCase()");
  QMessageLogger::debug();
  pQVar1 = QDebug::operator<<(&local_70,"Setting DPI to 96. ");
  pQVar1 = QDebug::operator<<(pQVar1,"Noto Sans");
  pQVar1 = QDebug::operator<<(pQVar1,"48 has a size of");
  QFontMetrics::QFontMetrics(local_98,local_20);
  t = QFontMetrics::height();
  QDebug::operator<<(pQVar1,t);
  QFontMetrics::~QFontMetrics(local_98);
  QDebug::~QDebug(&local_70);
  QMessageLogger::QMessageLogger
            (&local_c8,
             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
             ,0x31,"void KDReports::Test::initTestCase()");
  QMessageLogger::debug();
  operator<<((Stream *)&local_a0,(QFont *)&local_a8);
  QFontInfo::family();
  QDebug::operator<<(&local_a0,&local_e0);
  QString::~QString(&local_e0);
  QDebug::~QDebug(&local_a0);
  QDebug::~QDebug(&local_a8);
  QFontInfo::~QFontInfo(local_50);
  QFont::~QFont(local_20);
  return;
}

Assistant:

void initTestCase()
    {
        // Force the DPI do the same value as on Windows
        // (mostly for testFontScaling)
        qApp->setAttribute(Qt::AA_Use96Dpi, true);
        QFont font(s_fontName, 48);
        QFontInfo info(font);
        fontFound = (info.family() == s_fontName);
        qDebug() << "Setting DPI to 96. " << s_fontName << "48 has a size of" << QFontMetrics(font).height();
        qDebug() << font << info.family();
        // Unfortunately, Qt on Mac OSX hardcodes 72 DPI, so we'll always have different results there.
    }